

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drive_circle.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  ostream *poVar4;
  char *pcVar5;
  int baud;
  RobotModel model;
  Pose pose;
  string port;
  Create robot;
  
  std::__cxx11::string::string((string *)&port,"/dev/ttyUSB0",(allocator *)&robot);
  pcVar5 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)&robot,argv[1],(allocator *)&pose);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &robot,"create1");
    std::__cxx11::string::~string((string *)&robot);
    if (bVar2) {
      pcVar5 = "Running driver for Create 1";
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  create::Create::Create(&robot,1);
  cVar3 = create::Create::connect((string *)&robot,(int *)&port);
  if (cVar3 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    poVar4 = std::operator<<(poVar4,port._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar4);
    create::Create::~Create(&robot);
    std::__cxx11::string::~string((string *)&port);
    return 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::endl<char,std::char_traits<char>>(poVar4);
  pose.x = 4.2039e-45;
  create::Create::setMode((CreateMode *)&robot);
  usleep(100000);
  pose.x = 0.2;
  create::Create::driveRadius((float *)&robot,&pose.x);
  do {
    create::Create::getPose();
    lVar1 = std::cout;
    *(uint *)((long)&create::RobotModel::CREATE_2 + *(long *)(std::cout + -0x18)) =
         *(uint *)((long)&create::RobotModel::CREATE_2 + *(long *)(std::cout + -0x18)) & 0xfffffefb
         | 4;
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
    poVar4 = std::operator<<((ostream *)&std::cout,"\rOdometry (x, y, yaw): (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pose.x);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pose.y);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,pose.yaw);
    std::operator<<(poVar4,")      ");
    usleep(10000);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&pose.covariance);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // There's a delay between switching modes and when the robot will accept drive commands
  usleep(100000);

  // Command robot to drive a radius of 0.15 metres at 0.2 m/s
  robot.driveRadius(0.2, 0.15);

  while (true) {
    // Get robot odometry and print
    const create::Pose pose = robot.getPose();

    std::cout << std::fixed << std::setprecision(2) << "\rOdometry (x, y, yaw): ("
              << pose.x << ", " << pose.y << ", " << pose.yaw << ")      ";

    usleep(10000);  // 10 Hz
  }

  return 0;
}